

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O0

TokenType __thiscall
google::protobuf::io::Tokenizer::ConsumeNumber
          (Tokenizer *this,bool started_with_zero,bool started_with_dot)

{
  bool bVar1;
  TokenType TVar2;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  byte local_13;
  byte local_12;
  byte local_11;
  bool is_float;
  bool started_with_dot_local;
  Tokenizer *pTStack_10;
  bool started_with_zero_local;
  Tokenizer *this_local;
  
  local_13 = 0;
  local_12 = started_with_dot;
  local_11 = started_with_zero;
  pTStack_10 = this;
  if ((started_with_zero) &&
     ((bVar1 = TryConsume(this,'x'), bVar1 || (bVar1 = TryConsume(this,'X'), bVar1)))) {
    ConsumeOneOrMore<google::protobuf::io::(anonymous_namespace)::HexDigit>
              (this,"\"0x\" must be followed by hex digits.");
  }
  else if (((local_11 & 1) == 0) ||
          (bVar1 = LookingAt<google::protobuf::io::(anonymous_namespace)::Digit>(this), !bVar1)) {
    if ((local_12 & 1) == 0) {
      ConsumeZeroOrMore<google::protobuf::io::(anonymous_namespace)::Digit>(this);
      bVar1 = TryConsume(this,'.');
      if (bVar1) {
        local_13 = 1;
        ConsumeZeroOrMore<google::protobuf::io::(anonymous_namespace)::Digit>(this);
      }
    }
    else {
      local_13 = 1;
      ConsumeZeroOrMore<google::protobuf::io::(anonymous_namespace)::Digit>(this);
    }
    bVar1 = TryConsume(this,'e');
    if ((bVar1) || (bVar1 = TryConsume(this,'E'), bVar1)) {
      local_13 = 1;
      bVar1 = TryConsume(this,'-');
      if (!bVar1) {
        TryConsume(this,'+');
      }
      ConsumeOneOrMore<google::protobuf::io::(anonymous_namespace)::Digit>
                (this,"\"e\" must be followed by exponent.");
    }
    if (((this->allow_f_after_float_ & 1U) != 0) &&
       ((bVar1 = TryConsume(this,'f'), bVar1 || (bVar1 = TryConsume(this,'F'), bVar1)))) {
      local_13 = 1;
    }
  }
  else {
    ConsumeZeroOrMore<google::protobuf::io::(anonymous_namespace)::OctalDigit>(this);
    bVar1 = LookingAt<google::protobuf::io::(anonymous_namespace)::Digit>(this);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"Numbers starting with leading zero must be in octal.",
                 &local_39);
      AddError(this,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      std::allocator<char>::~allocator(&local_39);
      ConsumeZeroOrMore<google::protobuf::io::(anonymous_namespace)::Digit>(this);
    }
  }
  bVar1 = LookingAt<google::protobuf::io::(anonymous_namespace)::Letter>(this);
  if ((bVar1) && ((this->require_space_after_number_ & 1U) != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"Need space between number and identifier.",&local_71);
    AddError(this,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
  }
  else if (this->current_char_ == '.') {
    if ((local_13 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,"Hex and octal numbers must be integers.",&local_c1);
      AddError(this,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::allocator<char>::~allocator(&local_c1);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,
                 "Already saw decimal point or exponent; can\'t have another one.",&local_99);
      AddError(this,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator(&local_99);
    }
  }
  TVar2 = TYPE_INTEGER;
  if ((local_13 & 1) != 0) {
    TVar2 = TYPE_FLOAT;
  }
  return TVar2;
}

Assistant:

Tokenizer::TokenType Tokenizer::ConsumeNumber(bool started_with_zero,
                                              bool started_with_dot) {
  bool is_float = false;

  if (started_with_zero && (TryConsume('x') || TryConsume('X'))) {
    // A hex number (started with "0x").
    ConsumeOneOrMore<HexDigit>("\"0x\" must be followed by hex digits.");

  } else if (started_with_zero && LookingAt<Digit>()) {
    // An octal number (had a leading zero).
    ConsumeZeroOrMore<OctalDigit>();
    if (LookingAt<Digit>()) {
      AddError("Numbers starting with leading zero must be in octal.");
      ConsumeZeroOrMore<Digit>();
    }

  } else {
    // A decimal number.
    if (started_with_dot) {
      is_float = true;
      ConsumeZeroOrMore<Digit>();
    } else {
      ConsumeZeroOrMore<Digit>();

      if (TryConsume('.')) {
        is_float = true;
        ConsumeZeroOrMore<Digit>();
      }
    }

    if (TryConsume('e') || TryConsume('E')) {
      is_float = true;
      TryConsume('-') || TryConsume('+');
      ConsumeOneOrMore<Digit>("\"e\" must be followed by exponent.");
    }

    if (allow_f_after_float_ && (TryConsume('f') || TryConsume('F'))) {
      is_float = true;
    }
  }

  if (LookingAt<Letter>() && require_space_after_number_) {
    AddError("Need space between number and identifier.");
  } else if (current_char_ == '.') {
    if (is_float) {
      AddError(
          "Already saw decimal point or exponent; can't have another one.");
    } else {
      AddError("Hex and octal numbers must be integers.");
    }
  }

  return is_float ? TYPE_FLOAT : TYPE_INTEGER;
}